

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5WriteFlushLeaf(Fts5Index *p,Fts5SegWriter *pWriter)

{
  int *in_RSI;
  i64 in_RDI;
  Fts5Index *unaff_retaddr;
  i64 iRowid;
  Fts5PageWriter *pPage;
  Fts5SegWriter *in_stack_ffffffffffffffd8;
  Fts5Index *p_00;
  u32 nData;
  Fts5Buffer *pBuf;
  
  pBuf = (Fts5Buffer *)(in_RSI + 2);
  p_00 = (Fts5Index *)&DAT_aaaaaaaaaaaaaaaa;
  fts5PutU16((u8 *)(*(long *)(in_RSI + 4) + 2),(u16)in_RSI[6]);
  if (*(char *)((long)in_RSI + 0x4a) == '\0') {
    sqlite3Fts5BufferAppendBlob
              (in_RSI,pBuf,(u32)((ulong)p_00 >> 0x20),(u8 *)in_stack_ffffffffffffffd8);
  }
  else {
    fts5WriteBtreeNoTerm(p_00,in_stack_ffffffffffffffd8);
  }
  nData = (u32)((ulong)(((long)*in_RSI << 0x25) + (long)*(int *)&pBuf->p) >> 0x20);
  fts5DataWrite(unaff_retaddr,in_RDI,(u8 *)in_RSI,(int)((ulong)pBuf >> 0x20));
  sqlite3Fts5BufferZero((Fts5Buffer *)&pBuf->n);
  sqlite3Fts5BufferZero((Fts5Buffer *)&pBuf[1].n);
  sqlite3Fts5BufferAppendBlob(in_RSI,pBuf,nData,(u8 *)in_stack_ffffffffffffffd8);
  *(undefined4 *)((long)&pBuf->p + 4) = 0;
  *(int *)&pBuf->p = *(int *)&pBuf->p + 1;
  in_RSI[0x13] = in_RSI[0x13] + 1;
  *(undefined1 *)((long)in_RSI + 0x4a) = 1;
  *(undefined1 *)((long)in_RSI + 0x49) = 1;
  return;
}

Assistant:

static void fts5WriteFlushLeaf(Fts5Index *p, Fts5SegWriter *pWriter){
  static const u8 zero[] = { 0x00, 0x00, 0x00, 0x00 };
  Fts5PageWriter *pPage = &pWriter->writer;
  i64 iRowid;

  assert( (pPage->pgidx.n==0)==(pWriter->bFirstTermInPage) );

  /* Set the szLeaf header field. */
  assert( 0==fts5GetU16(&pPage->buf.p[2]) );
  fts5PutU16(&pPage->buf.p[2], (u16)pPage->buf.n);

  if( pWriter->bFirstTermInPage ){
    /* No term was written to this page. */
    assert( pPage->pgidx.n==0 );
    fts5WriteBtreeNoTerm(p, pWriter);
  }else{
    /* Append the pgidx to the page buffer. Set the szLeaf header field. */
    fts5BufferAppendBlob(&p->rc, &pPage->buf, pPage->pgidx.n, pPage->pgidx.p);
  }

  /* Write the page out to disk */
  iRowid = FTS5_SEGMENT_ROWID(pWriter->iSegid, pPage->pgno);
  fts5DataWrite(p, iRowid, pPage->buf.p, pPage->buf.n);

  /* Initialize the next page. */
  fts5BufferZero(&pPage->buf);
  fts5BufferZero(&pPage->pgidx);
  fts5BufferAppendBlob(&p->rc, &pPage->buf, 4, zero);
  pPage->iPrevPgidx = 0;
  pPage->pgno++;

  /* Increase the leaves written counter */
  pWriter->nLeafWritten++;

  /* The new leaf holds no terms or rowids */
  pWriter->bFirstTermInPage = 1;
  pWriter->bFirstRowidInPage = 1;
}